

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O0

Vec_Ptr_t * Sim_ComputeFunSupp(Abc_Ntk_t *pNtk,int fVerbose)

{
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  abctime aVar6;
  Sim_Man_t *p_00;
  abctime aVar7;
  abctime clk;
  int i;
  int nSolved;
  Vec_Ptr_t *vResult;
  Sim_Man_t *p;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  aVar6 = Abc_Clock();
  srand(0xabc);
  p_00 = Sim_ManStart(pNtk,0);
  Sim_UtilAssignRandom(p_00);
  Sim_ComputeSuppRound(p_00,0);
  Sim_ComputeSuppSetTargets(p_00);
  if (fVerbose != 0) {
    uVar2 = Vec_VecSizeSize(p_00->vSuppTargs);
    printf("Number of support targets after simulation = %5d.\n",(ulong)uVar2);
  }
  iVar3 = Vec_VecSizeSize(p_00->vSuppTargs);
  if (iVar3 != 0) {
    for (clk._0_4_ = 0; (int)clk < 1; clk._0_4_ = (int)clk + 1) {
      Sim_UtilAssignRandom(p_00);
      uVar2 = Sim_ComputeSuppRound(p_00,1);
      iVar3 = Vec_VecSizeSize(p_00->vSuppTargs);
      if (iVar3 == 0) goto LAB_005dc1a3;
      if (fVerbose != 0) {
        uVar4 = Vec_VecSizeSize(p_00->vSuppTargs);
        uVar5 = Vec_PtrSize(p_00->vFifo);
        printf("Targets = %5d.   Solved = %5d.  Fifo = %5d.\n",(ulong)uVar4,(ulong)uVar2,
               (ulong)uVar5);
      }
    }
    while (iVar3 = Vec_VecSizeSize(p_00->vSuppTargs), 0 < iVar3) {
      Sim_SolveTargetsUsingSat(p_00,p_00->nSimWords / p_00->nSuppWords);
      Sim_UtilAssignFromFifo(p_00);
      uVar2 = Sim_ComputeSuppRound(p_00,1);
      if (fVerbose != 0) {
        uVar4 = Vec_VecSizeSize(p_00->vSuppTargs);
        uVar5 = Vec_PtrSize(p_00->vFifo);
        printf("Targets = %5d.   Solved = %5d.  Fifo = %5d.  SAT runs = %3d.\n",(ulong)uVar4,
               (ulong)uVar2,(ulong)uVar5,(ulong)(uint)p_00->nSatRuns);
      }
    }
  }
LAB_005dc1a3:
  aVar7 = Abc_Clock();
  p_00->timeTotal = aVar7 - aVar6;
  pVVar1 = p_00->vSuppFun;
  Sim_ManStop(p_00);
  return pVVar1;
}

Assistant:

Vec_Ptr_t * Sim_ComputeFunSupp( Abc_Ntk_t * pNtk, int fVerbose )
{
    Sim_Man_t * p;
    Vec_Ptr_t * vResult;
    int nSolved, i;
    abctime clk = Abc_Clock();

    srand( 0xABC );

    // start the simulation manager
    p = Sim_ManStart( pNtk, 0 );

    // compute functional support using one round of random simulation
    Sim_UtilAssignRandom( p );
    Sim_ComputeSuppRound( p, 0 );

    // set the support targets 
    Sim_ComputeSuppSetTargets( p );
    if ( fVerbose )
        printf( "Number of support targets after simulation = %5d.\n", Vec_VecSizeSize(p->vSuppTargs) );
    if ( Vec_VecSizeSize(p->vSuppTargs) == 0 )
        goto exit;

    for ( i = 0; i < 1; i++ )
    {
        // compute patterns using one round of random simulation
        Sim_UtilAssignRandom( p );
        nSolved = Sim_ComputeSuppRound( p, 1 );
        if ( Vec_VecSizeSize(p->vSuppTargs) == 0 )
            goto exit;

        if ( fVerbose )
            printf( "Targets = %5d.   Solved = %5d.  Fifo = %5d.\n",
                Vec_VecSizeSize(p->vSuppTargs), nSolved, Vec_PtrSize(p->vFifo) );
    }

    // try to solve the support targets
    while ( Vec_VecSizeSize(p->vSuppTargs) > 0 )
    {
        // solve targets until the first disproved one (which gives counter-example)
        Sim_SolveTargetsUsingSat( p, p->nSimWords/p->nSuppWords );
        // compute additional functional support
        Sim_UtilAssignFromFifo( p );
        nSolved = Sim_ComputeSuppRound( p, 1 );

if ( fVerbose )
    printf( "Targets = %5d.   Solved = %5d.  Fifo = %5d.  SAT runs = %3d.\n", 
            Vec_VecSizeSize(p->vSuppTargs), nSolved, Vec_PtrSize(p->vFifo), p->nSatRuns );
    }

exit:
p->timeTotal = Abc_Clock() - clk;
    vResult = p->vSuppFun;  
    //  p->vSuppFun = NULL;
    Sim_ManStop( p );
    return vResult;
}